

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

ArrowTypeExtension * __thiscall
duckdb::DBConfig::GetArrowExtension
          (ArrowTypeExtension *__return_storage_ptr__,DBConfig *this,LogicalType *type)

{
  pthread_mutex_t *__mutex;
  pointer pAVar1;
  mapped_type *pmVar2;
  pointer pAVar3;
  reference pvVar4;
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  *this_00;
  ArrowExtensionMetadata *this_01;
  TypeInfo type_info;
  TypeInfo TStack_148;
  ArrowExtensionMetadata local_120;
  ArrowExtensionMetadata local_a0;
  
  this_00 = &this->arrow_extensions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(this_00);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  TypeInfo::TypeInfo(&TStack_148,type);
  pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
           ::operator->(this_00);
  pmVar2 = ::std::__detail::
           _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&pAVar1->type_to_info,&TStack_148);
  if ((pmVar2->
      super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>)
      .
      super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pmVar2->
      super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>)
      .
      super__Vector_base<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TStack_148.type = ANY;
    pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pAVar3 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pmVar2 = ::std::__detail::
             _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar3->type_to_info,&TStack_148);
    pvVar4 = vector<duckdb::ArrowExtensionMetadata,_true>::front(pmVar2);
    this_01 = &local_120;
    ArrowExtensionMetadata::ArrowExtensionMetadata(this_01,pvVar4);
    GetArrowExtensionInternal(__return_storage_ptr__,&pAVar1->type_extensions,this_01);
  }
  else {
    pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pAVar3 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_00);
    pmVar2 = ::std::__detail::
             _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar3->type_to_info,&TStack_148);
    pvVar4 = vector<duckdb::ArrowExtensionMetadata,_true>::front(pmVar2);
    this_01 = &local_a0;
    ArrowExtensionMetadata::ArrowExtensionMetadata(this_01,pvVar4);
    GetArrowExtensionInternal(__return_storage_ptr__,&pAVar1->type_extensions,this_01);
  }
  ArrowExtensionMetadata::~ArrowExtensionMetadata(this_01);
  ::std::__cxx11::string::~string((string *)&TStack_148);
  pthread_mutex_unlock(__mutex);
  return __return_storage_ptr__;
}

Assistant:

ArrowTypeExtension DBConfig::GetArrowExtension(const LogicalType &type) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	TypeInfo type_info(type);
	if (!arrow_extensions->type_to_info[type_info].empty()) {
		return GetArrowExtensionInternal(arrow_extensions->type_extensions,
		                                 arrow_extensions->type_to_info[type_info].front());
	}
	type_info.type = LogicalTypeId::ANY;
	return GetArrowExtensionInternal(arrow_extensions->type_extensions,
	                                 arrow_extensions->type_to_info[type_info].front());
}